

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_draw.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  float fVar2;
  ALLEGRO_COLOR AVar3;
  ALLEGRO_BITMAP *pAVar4;
  char cVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  long *plVar14;
  long lVar15;
  undefined8 uVar16;
  ALLEGRO_EVENT_QUEUE *pAVar17;
  undefined8 uVar18;
  float *pfVar19;
  char *in_RCX;
  int iVar20;
  long unaff_RBX;
  ulong uVar21;
  code *pcVar22;
  float *pfVar23;
  ulong uVar24;
  undefined4 in_XMM1_Da;
  undefined4 uVar25;
  float fVar26;
  float in_XMM1_Db;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  ALLEGRO_COLOR color;
  undefined8 uStack_bf0;
  undefined1 *puStack_be8;
  undefined1 *puStack_be0;
  undefined1 auStack_bd0 [8];
  code *pcStack_bc8;
  char *pcStack_bb8;
  char acStack_b20 [1032];
  undefined1 auStack_718 [1024];
  long lStack_318;
  undefined1 auStack_2f0 [4];
  int cx;
  long local_2e8;
  ulong local_2e0;
  float local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined8 local_2a8;
  ALLEGRO_BITMAP *local_298;
  int ch;
  int cw;
  int cy;
  uchar g;
  int local_260;
  float afStack_244 [3];
  uchar r;
  float local_234 [63];
  char str [256];
  
  pcVar22 = atexit;
  cVar5 = al_install_system(0x5020700);
  if (cVar5 == '\0') {
    pcVar11 = "Could not init Allegro.\n";
  }
  else {
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    al_init_image_addon();
    al_init_font_addon();
    ex.samples = 0;
    unaff_RBX = al_load_config_file("ex_draw.ini");
    if (unaff_RBX == 0) {
      unaff_RBX = al_create_config();
    }
    pcVar11 = (char *)al_get_config_value(unaff_RBX,"settings","samples");
    if (pcVar11 == (char *)0x0) {
      uVar12 = (ulong)(uint)ex.samples;
    }
    else {
      uVar12 = strtol(pcVar11,(char **)0x0,0);
      ex.samples = (int)uVar12;
    }
    in_RCX = str;
    sprintf(in_RCX,"%d",uVar12);
    al_set_config_value(unaff_RBX,"settings","samples");
    al_save_config_file("ex_draw.ini",unaff_RBX);
    al_destroy_config(unaff_RBX);
    if (ex.samples != 0) {
      al_set_new_display_option(0x11,1);
      al_set_new_display_option(0x12,ex.samples,2);
    }
    pcVar22 = (code *)0x280;
    lVar13 = al_create_display(0x280);
    if (lVar13 == 0) {
      pcVar11 = "Unable to create display.\n";
    }
    else {
      ex.FPS = 0x3c;
      pcVar22 = (code *)0x0;
      local_2e8 = lVar13;
      ex.font = (ALLEGRO_FONT *)al_load_font("data/fixed_font.tga",0,0);
      if (ex.font != (ALLEGRO_FONT *)0x0) {
        uVar16 = al_color_name("beige");
        ex.background.b = (float)in_XMM1_Da;
        ex.background.r = (float)(int)uVar16;
        ex.background.g = (float)(int)((ulong)uVar16 >> 0x20);
        ex.background.a = in_XMM1_Db;
        uVar16 = al_color_name("black");
        ex.foreground.b = (float)in_XMM1_Da;
        ex.foreground.r = (float)(int)uVar16;
        ex.foreground.g = (float)(int)((ulong)uVar16 >> 0x20);
        ex.foreground.a = in_XMM1_Db;
        uVar16 = al_color_name("red");
        ex.outline.b = (float)in_XMM1_Da;
        ex.outline.r = (float)(int)uVar16;
        ex.outline.g = (float)(int)((ulong)uVar16 >> 0x20);
        ex.outline.a = in_XMM1_Db;
        uVar16 = al_color_name("blue");
        ex.text.b = (float)in_XMM1_Da;
        ex.text.r = (float)(int)uVar16;
        ex.text.g = (float)(int)((ulong)uVar16 >> 0x20);
        ex.text.a = in_XMM1_Db;
        uVar16 = al_color_name("white");
        ex.white.b = (float)in_XMM1_Da;
        ex.white.r = (float)(int)uVar16;
        ex.white.g = (float)(int)((ulong)uVar16 >> 0x20);
        ex.white.a = in_XMM1_Db;
        ex.pattern = (ALLEGRO_BITMAP *)al_create_bitmap(0x20,0x20);
        ex.zoom = (ALLEGRO_BITMAP *)al_create_bitmap(0x20,0x20);
        pAVar4 = ex.pattern;
        uVar7 = al_get_bitmap_width(ex.pattern);
        uVar8 = al_get_bitmap_height(pAVar4);
        uVar25 = 0x3f800000;
        uVar27 = 0;
        uVar28 = 0;
        uVar29 = 0;
        local_2a8 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        local_2b8 = CONCAT44(uVar27,uVar25);
        fVar26 = 0.9;
        uVar25 = 0;
        uVar27 = 0;
        uVar30 = 0;
        uStack_2b0 = uVar28;
        uStack_2ac = uVar29;
        local_2c8 = al_map_rgb_f(0x3f800000,0x3f666666,0x3f4ccccd);
        local_298 = pAVar4;
        local_2d8 = fVar26;
        uStack_2d4 = uVar25;
        uStack_2d0 = uVar27;
        uStack_2cc = uVar30;
        plVar14 = (long *)al_lock_bitmap(pAVar4,0x13,2);
        uVar12 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar12 = 0;
        }
        local_2e0 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          local_2e0 = 0;
        }
        uVar16 = local_2c8;
        for (uVar21 = 0; uVar21 != local_2e0; uVar21 = uVar21 + 1) {
          lVar13 = 0;
          uVar24 = uVar21;
          while( true ) {
            local_2c8._0_4_ = (float)uVar16;
            if (uVar12 * 3 == lVar13) break;
            fVar26 = local_2d8;
            if ((uVar24 & 1) != 0) {
              local_2c8._0_4_ = (float)(int)local_2a8;
              fVar26 = (float)local_2b8;
            }
            lVar15 = *plVar14;
            al_unmap_rgb((float)local_2c8,fVar26,&r,&g,&cx);
            local_2c8 = uVar16;
            lVar15 = *(int *)((long)plVar14 + 0xc) * (int)uVar21 + lVar15;
            *(uchar *)(lVar13 + lVar15) = r;
            *(uchar *)(lVar13 + 1 + lVar15) = g;
            *(undefined1 *)(lVar13 + 2 + lVar15) = (undefined1)cx;
            lVar13 = lVar13 + 3;
            uVar24 = uVar24 + 1;
            uVar16 = local_2c8;
          }
        }
        local_2c8 = uVar16;
        al_unlock_bitmap(local_298);
        uVar16 = al_create_timer(SUB84(1.0 / (double)ex.FPS,0));
        pAVar17 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
        ex.queue = pAVar17;
        uVar18 = al_get_keyboard_event_source();
        al_register_event_source(pAVar17,uVar18);
        pAVar17 = ex.queue;
        uVar18 = al_get_mouse_event_source();
        al_register_event_source(pAVar17,uVar18);
        pAVar17 = ex.queue;
        uVar18 = al_get_display_event_source(local_2e8);
        al_register_event_source(pAVar17,uVar18);
        pAVar17 = ex.queue;
        uVar18 = al_get_timer_event_source(uVar16);
        al_register_event_source(pAVar17,uVar18);
        al_start_timer(uVar16);
        do {
          bVar6 = al_is_event_queue_empty(ex.queue);
          if (bVar6 != 0) {
            iVar9 = al_get_bitmap_width(ex.zoom);
            iVar10 = al_get_bitmap_height();
            uVar16 = al_get_target_bitmap();
            pfVar19 = local_234 + 2;
            for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
              fVar26 = (float)((int)lVar13 * 7) + (float)(int)lVar13 * 0.25 + 2.0;
              iVar20 = 0;
              pfVar23 = pfVar19;
              for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
                fVar2 = (float)iVar20 + (float)(int)lVar15 * 0.25 + 2.0;
                pfVar23[-3] = fVar2;
                pfVar23[-2] = fVar26;
                pfVar23[-1] = fVar2 + 5.0;
                *pfVar23 = fVar26 + 5.0;
                pfVar23 = pfVar23 + 4;
                iVar20 = iVar20 + 7;
              }
              pfVar19 = pfVar19 + 0x10;
            }
            al_get_clipping_rectangle(&cx,&cy,&cw,&ch);
            al_clear_to_color(ex.background.r);
            ex.text_x = 8.0;
            ex.text_y = 0.0;
            print("Drawing %s (press SPACE to change)",names[ex.what]);
            ex.text_x = 8.0;
            ex.text_y = 16.0;
            print("Original");
            ex.text_x = 80.0;
            ex.text_y = 16.0;
            print("Enlarged x 16");
            al_set_blender(0,1,0);
            local_2b8 = uVar16;
            local_2a8._0_4_ = iVar9;
            if (ex.software == true) {
              al_set_new_bitmap_flags(1);
              uVar16 = al_get_target_bitmap();
              uVar25 = al_get_bitmap_format(uVar16);
              al_set_new_bitmap_format(uVar25);
              uVar16 = al_create_bitmap(iVar9,iVar10);
              al_set_target_bitmap(uVar16);
              local_2c8._0_4_ = 0.0;
              local_2d8 = 0.0;
            }
            else {
              uVar16 = 0;
              local_2c8._0_4_ = 40.0;
              local_2d8 = 8.0;
            }
            al_draw_bitmap(ex.pattern,0);
            al_set_blender(0,1,3);
            for (lVar13 = 0xc; AVar3 = ex.foreground, lVar13 != 0x10c; lVar13 = lVar13 + 0x10) {
              color.a = ex.foreground.a * 0.5;
              color.b = ex.foreground.b;
              color.r = ex.foreground.r;
              color.g = ex.foreground.g;
              ex.foreground = AVar3;
              primitive(*(float *)((long)afStack_244 + lVar13) + local_2d8,
                        *(float *)((long)afStack_244 + lVar13 + 4) + (float)local_2c8,
                        *(float *)((long)afStack_244 + lVar13 + 8) + local_2d8,
                        *(float *)(&r + lVar13) + (float)local_2c8,color,false);
            }
            al_set_blender(0,1,0);
            uVar18 = local_2b8;
            if (ex.software == true) {
              al_set_target_bitmap(local_2b8);
              al_draw_bitmap(0x41000000,0x42200000,uVar16,0);
              al_destroy_bitmap(uVar16);
              local_2c8._0_4_ = 40.0;
              local_2d8 = 8.0;
            }
            al_set_target_bitmap(ex.zoom);
            iVar9 = (int)local_2a8;
            local_2e0 = CONCAT44(local_2e0._4_4_,(float)(int)local_2a8);
            local_2e8 = CONCAT44(local_2e8._4_4_,(float)iVar10);
            al_draw_bitmap_region
                      (local_2d8,(float)local_2c8,(float)(int)local_2a8,(float)iVar10,0,0,uVar18,0);
            al_set_target_bitmap(uVar18);
            al_draw_scaled_bitmap
                      (0,0,(undefined4)local_2e0,(undefined4)local_2e8,0x42a00000,0x42200000,
                       (float)(iVar9 << 4),(float)(iVar10 << 4),ex.zoom,0);
            for (lVar13 = 0xc; lVar13 != 0x10c; lVar13 = lVar13 + 0x10) {
              primitive(*(float *)((long)afStack_244 + lVar13) * 16.0 + 80.0,
                        *(float *)((long)afStack_244 + lVar13 + 4) * 16.0 + 40.0,
                        *(float *)((long)afStack_244 + lVar13 + 8) * 16.0 + 80.0,
                        *(float *)(&r + lVar13) * 16.0 + 40.0,ex.outline,true);
            }
            ex.text_x = 8.0;
            ex.text_y = 592.0;
            print("Thickness: %d (press T to change)",(ulong)(uint)ex.thickness);
            pcVar11 = "hardware";
            if (ex.software != false) {
              pcVar11 = "software";
            }
            print("Drawing with: %s (press S to change)",pcVar11);
            print("Supersampling: %dx (edit ex_draw.ini to change)",(ulong)(uint)ex.samples);
            al_flip_display();
          }
          bVar6 = bVar6 ^ 1;
          do {
            al_wait_for_event(ex.queue,&g);
            if (_g == 10) {
              if (local_260 == 0x13) {
                ex.software = (_Bool)(ex.software ^ 1);
              }
              else if (local_260 == 0x14) {
                ex.thickness = ex.thickness + 1;
                if (ex.thickness == 2) {
                  ex.thickness = 0;
                }
              }
              else if (local_260 == 0x4b) {
                ex.what = ex.what + 1;
                if (ex.what == 5) {
                  ex.what = 0;
                }
              }
              else if (local_260 == 0x3b) goto LAB_00102eda;
            }
            else {
              if (_g == 0x1e) break;
              if (_g == 0x2a) {
LAB_00102eda:
                al_destroy_event_queue(ex.queue);
                return 0;
              }
            }
            bVar1 = bVar6 & 1;
            bVar6 = 0;
          } while (bVar1 == 0);
        } while( true );
      }
      pcVar11 = "data/fixed_font.tga not found.\n";
      ex.font = (ALLEGRO_FONT *)0x0;
    }
  }
  abort_example(pcVar11);
  pcStack_bc8 = pcVar22;
  pcStack_bb8 = in_RCX;
  lStack_318 = unaff_RBX;
  iVar9 = al_get_font_line_height(ex.font);
  al_store_state(auStack_718,0x10);
  puStack_be8 = auStack_2f0;
  uStack_bf0 = 0x3000000008;
  puStack_be0 = auStack_bd0;
  vsnprintf(acStack_b20,0x400,pcVar11,&uStack_bf0);
  al_set_blender(0,1,3);
  al_draw_textf(ex.text.r,ex.text.b,ex.text_x,ex.text_y,ex.font,0,"%s",acStack_b20);
  iVar10 = al_restore_state(auStack_718);
  ex.text_y = (float)iVar9 + ex.text_y;
  return iVar10;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_CONFIG *config;
   char const *value;
   char str[256];

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();
   al_init_image_addon();
   al_init_font_addon();
   init_platform_specific();

   /* Read supersampling info from ex_draw.ini. */
   ex.samples = 0;
   config = al_load_config_file("ex_draw.ini");
   if (!config)
      config = al_create_config();
   value = al_get_config_value(config, "settings", "samples");
   if (value)
      ex.samples = strtol(value, NULL, 0);
   sprintf(str, "%d", ex.samples);
   al_set_config_value(config, "settings", "samples", str);
   al_save_config_file("ex_draw.ini", config);
   al_destroy_config(config);

   if (ex.samples) {
      al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_REQUIRE);
      al_set_new_display_option(ALLEGRO_SAMPLES, ex.samples, ALLEGRO_SUGGEST);
   }
   display = al_create_display(640, 640);
   if (!display) {
      abort_example("Unable to create display.\n");
   }

   init();

   timer = al_create_timer(1.0 / ex.FPS);

   ex.queue = al_create_event_queue();
   al_register_event_source(ex.queue, al_get_keyboard_event_source());
   al_register_event_source(ex.queue, al_get_mouse_event_source());
   al_register_event_source(ex.queue, al_get_display_event_source(display));
   al_register_event_source(ex.queue, al_get_timer_event_source(timer));

   al_start_timer(timer);
   run();

   al_destroy_event_queue(ex.queue);  

   return 0;
}